

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiTableSettings * ImGui::TableGetBoundSettings(ImGuiTable *table)

{
  ImGuiTableSettings *pIVar1;
  ImGuiID *in_RDI;
  ImGuiTableSettings *settings;
  ImGuiContext *g;
  int in_stack_ffffffffffffffdc;
  ImChunkStream<ImGuiTableSettings> *in_stack_ffffffffffffffe0;
  
  if (in_RDI[0x19] != 0xffffffff) {
    pIVar1 = ImChunkStream<ImGuiTableSettings>::ptr_from_offset
                       (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    if (pIVar1->ID != *in_RDI) {
      __assert_fail("settings->ID == table->ID",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                    ,0xc16,"ImGuiTableSettings *ImGui::TableGetBoundSettings(ImGuiTable *)");
    }
    if ((int)in_RDI[0x1b] <= (int)pIVar1->ColumnsCountMax) {
      return pIVar1;
    }
    pIVar1->ID = 0;
  }
  return (ImGuiTableSettings *)0x0;
}

Assistant:

ImGuiTableSettings* ImGui::TableGetBoundSettings(ImGuiTable* table)
{
    if (table->SettingsOffset != -1)
    {
        ImGuiContext& g = *GImGui;
        ImGuiTableSettings* settings = g.SettingsTables.ptr_from_offset(table->SettingsOffset);
        IM_ASSERT(settings->ID == table->ID);
        if (settings->ColumnsCountMax >= table->ColumnsCount)
            return settings; // OK
        settings->ID = 0; // Invalidate storage, we won't fit because of a count change
    }
    return NULL;
}